

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O0

optional<siginfo_t> * __thiscall
pstack::Procman::CoreProcess::getSignalInfo
          (optional<siginfo_t> *__return_storage_ptr__,CoreProcess *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  element_type *this_00;
  element_type *this_01;
  shared_ptr<const_pstack::Reader> local_188;
  anon_struct_128_5_975a5653_for__M_value local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  NoteDesc local_d8;
  NoteDesc *local_b8;
  NoteDesc *note;
  iterator local_a0 [8];
  iterator __end2;
  iterator local_60 [8];
  iterator __begin2;
  Object *local_20;
  Object **local_18;
  Notes *__range2;
  CoreProcess *this_local;
  
  __range2 = (Notes *)this;
  this_00 = std::__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->coreImage);
  local_20 = (Object *)Elf::Object::notes(this_00);
  local_18 = &local_20;
  pstack::Elf::Notes::begin();
  pstack::Elf::Notes::end();
  while (bVar1 = Elf::Notes::iterator::operator!=(local_60,local_a0), bVar1) {
    Elf::Notes::iterator::operator*(&local_d8,local_60);
    local_b8 = &local_d8;
    pstack::Elf::NoteDesc::name_abi_cxx11_();
    bVar2 = std::operator==(&local_f8,"CORE");
    bVar1 = false;
    if (bVar2) {
      iVar3 = Elf::NoteDesc::type(local_b8);
      bVar1 = iVar3 == 0x53494749;
    }
    std::__cxx11::string::~string((string *)&local_f8);
    if (bVar1) {
      pstack::Elf::NoteDesc::data();
      this_01 = std::
                __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_188);
      Reader::readObj<siginfo_t>(&local_178,this_01,0);
      std::optional<siginfo_t>::optional<siginfo_t,_true>(__return_storage_ptr__,&local_178);
      std::shared_ptr<const_pstack::Reader>::~shared_ptr(&local_188);
    }
    note._0_4_ = (uint)bVar1;
    Elf::NoteDesc::~NoteDesc(&local_d8);
    if ((uint)note != 0) goto LAB_0018df1e;
    pstack::Elf::Notes::iterator::operator++(local_60);
  }
  note._0_4_ = 2;
LAB_0018df1e:
  Elf::Notes::iterator::~iterator(local_a0);
  Elf::Notes::iterator::~iterator(local_60);
  if ((uint)note != 1) {
    std::optional<siginfo_t>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<siginfo_t>
CoreProcess::getSignalInfo() const {
   for ( const auto &note : coreImage->notes() ) {
      if ( note.name() == "CORE" && note.type() == NT_SIGINFO ) {
         return note.data()->readObj<siginfo_t>(0);
      }
   }
   return std::nullopt;
}